

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

int ZSTD_literalsCompressionIsDisabled(ZSTD_CCtx_params *cctxParams)

{
  ZSTD_paramSwitch_e ZVar1;
  bool local_1d;
  ZSTD_CCtx_params *cctxParams_local;
  
  ZVar1 = cctxParams->literalCompressionMode;
  if (ZVar1 == ZSTD_ps_auto) {
    local_1d = false;
    if ((cctxParams->cParams).strategy == ZSTD_fast) {
      local_1d = (cctxParams->cParams).targetLength != 0;
    }
    cctxParams_local._4_4_ = (uint)local_1d;
  }
  else if (ZVar1 == ZSTD_ps_enable) {
    cctxParams_local._4_4_ = 0;
  }
  else {
    if (ZVar1 != ZSTD_ps_disable) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x264,"int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params *)");
    }
    cctxParams_local._4_4_ = 1;
  }
  return cctxParams_local._4_4_;
}

Assistant:

MEM_STATIC int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params* cctxParams)
{
    switch (cctxParams->literalCompressionMode) {
    case ZSTD_ps_enable:
        return 0;
    case ZSTD_ps_disable:
        return 1;
    default:
        assert(0 /* impossible: pre-validated */);
        ZSTD_FALLTHROUGH;
    case ZSTD_ps_auto:
        return (cctxParams->cParams.strategy == ZSTD_fast) && (cctxParams->cParams.targetLength > 0);
    }
}